

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>
         *this)

{
  TestLog *pTVar1;
  qpTestLog *pqVar2;
  ostringstream *poVar3;
  float fVar4;
  Precision PVar5;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar6;
  Statement *pSVar7;
  ShaderExecutor *pSVar8;
  Variable<tcu::Vector<float,_2>_> *pVVar9;
  pointer pcVar10;
  Variable<tcu::Matrix<float,_2,_2>_> *pVVar11;
  byte bVar12;
  pointer pMVar13;
  pointer pVVar14;
  bool bVar15;
  bool bVar16;
  int iVar17;
  uint uVar18;
  _Rb_tree_node_base *p_Var19;
  IVal *pIVar20;
  IVal *pIVar21;
  long lVar22;
  long *plVar23;
  Vector<float,_2> *val;
  TestLog TVar24;
  qpTestLog *pqVar25;
  long lVar26;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>
  *pBVar27;
  TestStatus *pTVar28;
  byte bVar29;
  FloatFormat *pFVar30;
  IVal in2;
  IVal in1;
  IVal in3;
  FuncSet funcs;
  FloatFormat highpFmt;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_> outputs;
  IVal reference0;
  Environment env;
  void *outputArr [2];
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  void *inputArr [4];
  ResultCollector status;
  ostringstream oss;
  float in_stack_fffffffffffffa88;
  float fVar31;
  size_type local_570;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_568;
  undefined1 local_558 [16];
  undefined1 local_548 [48];
  string local_518;
  undefined1 local_4f8 [8];
  undefined8 uStack_4f0;
  TestLog TStack_4e8;
  _Rb_tree_node_base *local_4e0;
  _Base_ptr local_4d8;
  double dStack_4d0;
  TestStatus *local_4c8;
  ulong local_4c0;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>
  *local_4b8;
  FloatFormat *local_4b0;
  FloatFormat local_4a8;
  long local_480;
  long local_478;
  long local_470;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>
  local_468;
  undefined1 local_438 [20];
  YesNoMaybe YStack_424;
  Interval IStack_420;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_408;
  undefined4 uStack_400;
  undefined4 uStack_3fc;
  double local_3f8;
  Interval local_3f0;
  ios_base local_3c8 [8];
  ios_base local_3c0 [264];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_2b8;
  pointer local_288;
  pointer local_280;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_278;
  pointer local_218;
  pointer local_210;
  pointer local_208;
  pointer local_200;
  ResultCollector local_1f8;
  undefined1 local_1a8 [48];
  IVal local_178;
  ios_base local_138 [264];
  
  this_00 = this->m_samplings;
  pFVar30 = &(this->m_caseCtx).floatFormat;
  PVar5 = (this->m_caseCtx).precision;
  sVar6 = (this->m_caseCtx).numRandoms;
  local_4c8 = __return_storage_ptr__;
  iVar17 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_4b0 = pFVar30;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_278,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar30,(FloatFormat *)(ulong)PVar5,(Precision)sVar6,(ulong)(iVar17 + 0xdeadbeef),
             (deUint32)in_stack_fffffffffffffa88);
  pVVar14 = local_278.in0.
            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_548._40_8_ =
       (long)local_278.in0.
             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)local_278.in0.
             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>::Outputs
            (&local_468,local_548._40_8_);
  local_4a8.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_4a8.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_4a8.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_4a8.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_4a8.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_4a8.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_4a8.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_4a8.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_4a8._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2b8._M_impl.super__Rb_tree_header._M_header;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2b8._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_1f8);
  local_548._32_8_ = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_218 = local_278.in0.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_210 = local_278.in1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_208 = local_278.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_200 = local_278.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_288 = local_468.out0.
              super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_280 = local_468.out1.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  poVar3 = (ostringstream *)(local_438 + 8);
  local_438._0_8_ = local_548._32_8_;
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81(poVar3,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_4b8 = this;
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_3c0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  uStack_4f0 = (double)((ulong)uStack_4f0._4_4_ << 0x20);
  TStack_4e8.m_log = (qpTestLog *)0x0;
  dStack_4d0 = 0.0;
  pSVar7 = (local_4b8->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_4e0 = (_Rb_tree_node_base *)&uStack_4f0;
  local_4d8 = (_Rb_tree_node_base *)&uStack_4f0;
  (*pSVar7->_vptr_Statement[4])(pSVar7,local_4f8);
  if (local_4e0 != (_Rb_tree_node_base *)&uStack_4f0) {
    p_Var19 = local_4e0;
    do {
      (**(code **)(**(long **)(p_Var19 + 1) + 0x30))(*(long **)(p_Var19 + 1),local_1a8);
      p_Var19 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var19);
    } while (p_Var19 != (_Rb_tree_node_base *)&uStack_4f0);
  }
  pBVar27 = local_4b8;
  if (dStack_4d0 != 0.0) {
    poVar3 = (ostringstream *)(local_438 + 8);
    local_438._0_8_ = local_548._32_8_;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,(char *)local_558._0_8_,local_558._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((IVal *)local_558._0_8_ != (IVal *)local_548) {
      operator_delete((void *)local_558._0_8_,local_548._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_3c0);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_4f8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  pSVar8 = (pBVar27->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  (*pSVar8->_vptr_ShaderExecutor[2])(pSVar8,local_548._40_8_,&local_218,&local_288,0);
  local_1a8._0_8_ = local_1a8._0_8_ & 0xffffffffffffff00;
  local_1a8._8_8_ = INFINITY;
  local_1a8._16_8_ = (qpTestLog *)0xfff0000000000000;
  local_1a8._24_8_ = local_1a8._24_8_ & 0xffffffffffffff00;
  local_1a8._32_8_ = (_Base_ptr)0x7ff0000000000000;
  local_1a8._40_8_ = -INFINITY;
  tcu::Matrix<tcu::Interval,_2,_2>::Matrix((Matrix<tcu::Interval,_2,_2> *)local_438);
  local_4f8 = (undefined1  [8])((ulong)local_4f8 & 0xffffffffffffff00);
  uStack_4f0 = INFINITY;
  TStack_4e8.m_log = (qpTestLog *)0xfff0000000000000;
  local_4e0 = (_Rb_tree_node_base *)((ulong)local_4e0 & 0xffffffffffffff00);
  local_4d8 = (_Base_ptr)0x7ff0000000000000;
  dStack_4d0 = -INFINITY;
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_2b8,
             (pBVar27->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr,
             (IVal *)local_1a8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_2b8,
             (pBVar27->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)local_558);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_2b8,
             (pBVar27->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&stack0xfffffffffffffa88);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_2b8,
             (pBVar27->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_518);
  Environment::bind<tcu::Matrix<float,2,2>>
            ((Environment *)&local_2b8,
             (pBVar27->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>.m_ptr,
             (IVal *)local_438);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_2b8,
             (pBVar27->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr,
             (IVal *)local_4f8);
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_finish == pVVar14) {
LAB_0092205a:
    poVar3 = (ostringstream *)(local_438 + 8);
    local_438._0_8_ = local_548._32_8_;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_3c0);
    local_438._0_8_ = (TestLog *)(local_438 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"Pass","");
    local_4c8->m_code = QP_TEST_RESULT_PASS;
    (local_4c8->m_description)._M_dataplus._M_p = (pointer)&(local_4c8->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4c8->m_description,local_438._0_8_,
               (undefined1 *)
               ((long)(qpTestLog **)local_438._0_8_ + CONCAT44(local_438._12_4_,local_438._8_4_)));
    pTVar28 = local_4c8;
    if ((TestLog *)local_438._0_8_ != (TestLog *)(local_438 + 0x10)) {
      operator_delete((void *)local_438._0_8_,CONCAT44(YStack_424,local_438._16_4_) + 1);
      pTVar28 = local_4c8;
    }
    goto LAB_0092224d;
  }
  local_480 = local_548._40_8_ + (ulong)((double)local_548._40_8_ == 0.0);
  lVar26 = 0;
  local_4c0 = 0;
  pFVar30 = local_4b0;
  do {
    tcu::Matrix<tcu::Interval,_2,_2>::Matrix((Matrix<tcu::Interval,_2,_2> *)local_1a8);
    local_4f8 = (undefined1  [8])((ulong)local_4f8 & 0xffffffffffffff00);
    uStack_4f0 = INFINITY;
    TStack_4e8.m_log = (qpTestLog *)0xfff0000000000000;
    local_4e0 = (_Rb_tree_node_base *)((ulong)local_4e0 & 0xffffffffffffff00);
    local_4d8 = (_Base_ptr)0x7ff0000000000000;
    dStack_4d0 = -INFINITY;
    fVar31 = local_278.in0.
             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar26].m_data[0];
    fVar4 = local_278.in0.
            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar26].m_data[1];
    ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doRound
              ((IVal *)local_558,pFVar30,(Vector<float,_2> *)&stack0xfffffffffffffa88);
    ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
              ((IVal *)local_438,pFVar30,(IVal *)local_558);
    pIVar20 = Environment::lookup<tcu::Vector<float,2>>
                        ((Environment *)&local_2b8,
                         (pBVar27->m_variables).in0.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                         .m_ptr);
    pIVar20->m_data[1].m_lo = IStack_420.m_lo;
    pIVar20->m_data[1].m_hi = (double)CONCAT44(IStack_420.m_hi._4_4_,IStack_420.m_hi._0_4_);
    pIVar20->m_data[0].m_hi = (double)CONCAT44(YStack_424,local_438._16_4_);
    *(ulong *)(pIVar20->m_data + 1) = CONCAT44(IStack_420._4_4_,IStack_420._0_4_);
    *(undefined8 *)pIVar20->m_data = local_438._0_8_;
    pIVar20->m_data[0].m_lo = (double)CONCAT44(local_438._12_4_,local_438._8_4_);
    Environment::lookup<vkt::shaderexecutor::Void>
              ((Environment *)&local_2b8,
               (pBVar27->m_variables).in1.
               super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
               m_ptr);
    Environment::lookup<vkt::shaderexecutor::Void>
              ((Environment *)&local_2b8,
               (pBVar27->m_variables).in2.
               super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
               m_ptr);
    Environment::lookup<vkt::shaderexecutor::Void>
              ((Environment *)&local_2b8,
               (pBVar27->m_variables).in3.
               super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
               m_ptr);
    IStack_420.m_hi._0_4_ = (pBVar27->m_caseCtx).precision;
    IStack_420.m_lo = pFVar30->m_maxValue;
    local_438._0_8_ = *(undefined8 *)pFVar30;
    local_438._8_4_ = pFVar30->m_fractionBits;
    local_438._12_4_ = pFVar30->m_hasSubnormal;
    local_438._16_4_ = pFVar30->m_hasInf;
    YStack_424 = pFVar30->m_hasNaN;
    IStack_420.m_hasNaN = pFVar30->m_exactPrecision;
    IStack_420._1_3_ = *(undefined3 *)&pFVar30->field_0x19;
    IStack_420._4_4_ = *(undefined4 *)&pFVar30->field_0x1c;
    uStack_400 = 0;
    pSVar7 = (pBVar27->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
    local_408 = &local_2b8;
    (*pSVar7->_vptr_Statement[3])(pSVar7,(MessageBuilder *)local_438);
    pIVar20 = Environment::lookup<tcu::Vector<float,2>>
                        ((Environment *)&local_2b8,
                         (pBVar27->m_variables).out1.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                         .m_ptr);
    ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
              ((IVal *)local_438,&local_4a8,pIVar20);
    uStack_4f0 = (double)CONCAT44(local_438._12_4_,local_438._8_4_);
    TStack_4e8.m_log = (qpTestLog *)CONCAT44(YStack_424,local_438._16_4_);
    local_4e0 = (_Rb_tree_node_base *)CONCAT44(IStack_420._4_4_,IStack_420._0_4_);
    dStack_4d0 = (double)CONCAT44(IStack_420.m_hi._4_4_,IStack_420.m_hi._0_4_);
    local_4d8 = (_Base_ptr)IStack_420.m_lo;
    local_4f8 = (undefined1  [8])local_438._0_8_;
    local_470 = lVar26 * 8;
    bVar15 = contains<tcu::Vector<float,2>>
                       ((IVal *)local_4f8,
                        local_468.out1.
                        super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar26);
    local_438._0_8_ = local_438 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_438,"Shader output 1 is outside acceptable range","");
    bVar15 = tcu::ResultCollector::check(&local_1f8,bVar15,(string *)local_438);
    if ((TestLog *)local_438._0_8_ != (TestLog *)(local_438 + 0x10)) {
      operator_delete((void *)local_438._0_8_,CONCAT44(YStack_424,local_438._16_4_) + 1);
    }
    pIVar21 = Environment::lookup<tcu::Matrix<float,2,2>>
                        ((Environment *)&local_2b8,
                         (pBVar27->m_variables).out0.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>
                         .m_ptr);
    ContainerTraits<tcu::Matrix<float,_2,_2>,_tcu::Matrix<tcu::Interval,_2,_2>_>::doConvert
              ((IVal *)local_438,&local_4a8,pIVar21);
    pMVar13 = local_468.out0.
              super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_1a8._16_8_ = CONCAT44(YStack_424,local_438._16_4_);
    local_1a8._8_8_ = CONCAT44(local_438._12_4_,local_438._8_4_);
    local_1a8._0_8_ = local_438._0_8_;
    local_178.m_data[0].m_hi = local_3f8;
    local_178.m_data[0].m_lo = (double)CONCAT44(uStack_3fc,uStack_400);
    local_178.m_data[0]._0_8_ = local_408;
    local_1a8._40_8_ = CONCAT44(IStack_420.m_hi._4_4_,IStack_420.m_hi._0_4_);
    local_1a8._24_8_ = CONCAT44(IStack_420._4_4_,IStack_420._0_4_);
    local_1a8._32_8_ = IStack_420.m_lo;
    local_178.m_data[1].m_hi = local_3f0.m_hi;
    local_178.m_data[1].m_hasNaN = local_3f0.m_hasNaN;
    local_178.m_data[1]._1_7_ = local_3f0._1_7_;
    local_178.m_data[1].m_lo = local_3f0.m_lo;
    local_478 = lVar26 * 0x10;
    bVar29 = 1;
    pIVar20 = (IVal *)local_1a8;
    lVar22 = 0;
    do {
      bVar16 = contains<tcu::Vector<float,2>>(pIVar20,pMVar13[lVar26].m_data.m_data + lVar22);
      lVar22 = 1;
      pIVar20 = &local_178;
      bVar12 = bVar29 & bVar16;
      bVar29 = 0;
    } while (bVar12 != 0);
    local_438._0_8_ = local_438 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_438,"Shader output 0 is outside acceptable range","");
    pFVar30 = local_4b0;
    bVar16 = tcu::ResultCollector::check(&local_1f8,bVar16,(string *)local_438);
    pBVar27 = local_4b8;
    if ((TestLog *)local_438._0_8_ != (TestLog *)(local_438 + 0x10)) {
      operator_delete((void *)local_438._0_8_,CONCAT44(YStack_424,local_438._16_4_) + 1);
    }
    if (!bVar15 || !bVar16) {
      uVar18 = (int)local_4c0 + 1;
      local_4c0 = (ulong)uVar18;
      poVar3 = (ostringstream *)(local_438 + 8);
      if ((int)uVar18 < 0x65) {
        local_438._0_8_ = local_548._32_8_;
        std::__cxx11::ostringstream::ostringstream(poVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Failed",6);
        lVar22 = local_470;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
        pVVar9 = (pBVar27->m_variables).in0.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr
        ;
        val = (Vector<float,_2> *)local_548;
        pcVar10 = (pVVar9->m_name)._M_dataplus._M_p;
        local_558._0_8_ = val;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_558,pcVar10,pcVar10 + (pVVar9->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,(char *)local_558._0_8_,local_558._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," = ",3);
        valueToString<tcu::Vector<float,2>>
                  ((string *)&stack0xfffffffffffffa88,(shaderexecutor *)&local_4a8,
                   (FloatFormat *)
                   ((long)(local_278.in0.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar22),val);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,(char *)CONCAT44(fVar4,fVar31),local_570);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(fVar4,fVar31) != &local_568) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(fVar4,fVar31),local_568._M_allocated_capacity + 1);
        }
        if ((Vector<float,_2> *)local_558._0_8_ != (Vector<float,_2> *)local_548) {
          operator_delete((void *)local_558._0_8_,local_548._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
        pVVar11 = (pBVar27->m_variables).out0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>.
                  m_ptr;
        pIVar21 = (IVal *)local_548;
        pcVar10 = (pVVar11->m_name)._M_dataplus._M_p;
        local_558._0_8_ = pIVar21;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_558,pcVar10,pcVar10 + (pVVar11->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,(char *)local_558._0_8_,local_558._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," = ",3);
        valueToString<tcu::Matrix<float,2,2>>
                  ((string *)&stack0xfffffffffffffa88,(shaderexecutor *)&local_4a8,
                   (FloatFormat *)
                   ((long)((local_468.out0.
                            super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                   local_478),(Matrix<float,_2,_2> *)pIVar21);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,(char *)CONCAT44(fVar4,fVar31),local_570);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,2,2>>
                  (&local_518,(shaderexecutor *)&local_4a8,(FloatFormat *)local_1a8,pIVar21);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,local_518._M_dataplus._M_p,local_518._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_518._M_dataplus._M_p != &local_518.field_2) {
          operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(fVar4,fVar31) != &local_568) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(fVar4,fVar31),local_568._M_allocated_capacity + 1);
        }
        if ((IVal *)local_558._0_8_ != (IVal *)local_548) {
          operator_delete((void *)local_558._0_8_,local_548._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
        pVVar9 = (pBVar27->m_variables).out1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr
        ;
        pIVar20 = (IVal *)local_548;
        pcVar10 = (pVVar9->m_name)._M_dataplus._M_p;
        local_558._0_8_ = pIVar20;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_558,pcVar10,pcVar10 + (pVVar9->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,(char *)local_558._0_8_,local_558._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," = ",3);
        valueToString<tcu::Vector<float,2>>
                  ((string *)&stack0xfffffffffffffa88,(shaderexecutor *)&local_4a8,
                   (FloatFormat *)
                   ((long)(local_468.out1.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar22),
                   (Vector<float,_2> *)pIVar20);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,(char *)CONCAT44(fVar4,fVar31),local_570);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,"\tExpected range: ",0x11);
        intervalToString<tcu::Vector<float,2>>
                  (&local_518,(shaderexecutor *)&local_4a8,(FloatFormat *)local_4f8,pIVar20);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,local_518._M_dataplus._M_p,local_518._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_518._M_dataplus._M_p != &local_518.field_2) {
          operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(fVar4,fVar31) != &local_568) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(fVar4,fVar31),local_568._M_allocated_capacity + 1);
        }
        if ((IVal *)local_558._0_8_ != (IVal *)local_548) {
          operator_delete((void *)local_558._0_8_,local_548._0_8_ + 1);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar3);
        std::ios_base::~ios_base(local_3c0);
      }
    }
    lVar26 = lVar26 + 1;
  } while (lVar26 != local_480);
  iVar17 = (int)local_4c0;
  if (iVar17 < 0x65) {
    if (iVar17 == 0) goto LAB_0092205a;
  }
  else {
    poVar3 = (ostringstream *)(local_438 + 8);
    local_438._0_8_ = local_548._32_8_;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"(Skipped ",9);
    std::ostream::operator<<(poVar3,iVar17 + -100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," messages.)",0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_3c0);
  }
  poVar3 = (ostringstream *)(local_438 + 8);
  local_438._0_8_ = local_548._32_8_;
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::ostream::operator<<(poVar3,iVar17);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"/",1);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs failed.",0xf);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_3c0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
  std::ostream::operator<<(local_438,iVar17);
  pTVar28 = local_4c8;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
  std::ios_base::~ios_base(local_3c8);
  local_438._0_8_ = local_438 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_438," test failed. Check log for the details","");
  pqVar2 = (qpTestLog *)(CONCAT44(local_438._12_4_,local_438._8_4_) + (long)uStack_4f0);
  TVar24.m_log = (qpTestLog *)0xf;
  if (local_4f8 != (undefined1  [8])&TStack_4e8) {
    TVar24.m_log = TStack_4e8.m_log;
  }
  if (TVar24.m_log < pqVar2) {
    pqVar25 = (qpTestLog *)0xf;
    if ((TestLog *)local_438._0_8_ != (TestLog *)(local_438 + 0x10)) {
      pqVar25 = (qpTestLog *)CONCAT44(YStack_424,local_438._16_4_);
    }
    if (pqVar25 < pqVar2) goto LAB_00922048;
    plVar23 = (long *)std::__cxx11::string::replace((ulong)local_438,0,(char *)0x0,(ulong)local_4f8)
    ;
  }
  else {
LAB_00922048:
    plVar23 = (long *)std::__cxx11::string::_M_append(local_4f8,local_438._0_8_);
  }
  local_1a8._0_8_ = local_1a8 + 0x10;
  pTVar1 = (TestLog *)(plVar23 + 2);
  if ((TestLog *)*plVar23 == pTVar1) {
    local_1a8._16_8_ = pTVar1->m_log;
    local_1a8._24_8_ = plVar23[3];
  }
  else {
    local_1a8._16_8_ = pTVar1->m_log;
    local_1a8._0_8_ = (TestLog *)*plVar23;
  }
  local_1a8._8_8_ = plVar23[1];
  *plVar23 = (long)pTVar1;
  plVar23[1] = 0;
  *(undefined1 *)&pTVar1->m_log = 0;
  pTVar28->m_code = QP_TEST_RESULT_FAIL;
  (pTVar28->m_description)._M_dataplus._M_p = (pointer)&(pTVar28->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pTVar28->m_description,local_1a8._0_8_,
             (undefined1 *)((long)(qpTestLog **)local_1a8._0_8_ + local_1a8._8_8_));
  if ((TestLog *)local_1a8._0_8_ != (TestLog *)(local_1a8 + 0x10)) {
    operator_delete((void *)local_1a8._0_8_,(ulong)((long)(deUint32 *)local_1a8._16_8_ + 1));
  }
  if ((TestLog *)local_438._0_8_ != (TestLog *)(local_438 + 0x10)) {
    operator_delete((void *)local_438._0_8_,CONCAT44(YStack_424,local_438._16_4_) + 1);
  }
  if (local_4f8 != (undefined1  [8])&TStack_4e8) {
    operator_delete((void *)local_4f8,(ulong)((long)&(TStack_4e8.m_log)->flags + 1));
  }
LAB_0092224d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_message._M_dataplus._M_p != &local_1f8.m_message.field_2) {
    operator_delete(local_1f8.m_message._M_dataplus._M_p,
                    local_1f8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_prefix._M_dataplus._M_p != &local_1f8.m_prefix.field_2) {
    operator_delete(local_1f8.m_prefix._M_dataplus._M_p,
                    local_1f8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_2b8);
  if (local_468.out1.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_468.out1.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_468.out1.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_468.out1.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_468.out0.
      super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_468.out0.
                    super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_468.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_468.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar28;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}